

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ECUPort.cc
# Opt level: O0

Values * __thiscall
SSM::ECUPort::singleRead(Values *__return_storage_ptr__,ECUPort *this,Observables *observables)

{
  Observables *this_00;
  bool bVar1;
  int iVar2;
  value_type_conflict1 local_98;
  reference local_90;
  Observable **obs;
  const_iterator __end1;
  const_iterator __begin1;
  Observables *__range1;
  __normal_iterator<const_std::byte_*,_std::vector<std::byte,_std::allocator<std::byte>_>_> local_68
  ;
  const_iterator it;
  Bytes response;
  Bytes local_38;
  Observables *local_20;
  Observables *observables_local;
  ECUPort *this_local;
  Values *values;
  
  local_20 = observables;
  observables_local = (Observables *)this;
  this_local = (ECUPort *)__return_storage_ptr__;
  buildReadRequest(&local_38,this,observables,false);
  sendRequest(this,&local_38,3);
  std::vector<std::byte,_std::allocator<std::byte>_>::~vector(&local_38);
  readECUPacket((Bytes *)&it,this,false);
  local_68._M_current = (byte *)skipToData((Bytes *)&it);
  std::vector<double,_std::allocator<double>_>::vector(__return_storage_ptr__);
  this_00 = local_20;
  __end1 = std::vector<const_SSM::Observable_*,_std::allocator<const_SSM::Observable_*>_>::begin
                     (local_20);
  obs = (Observable **)
        std::vector<const_SSM::Observable_*,_std::allocator<const_SSM::Observable_*>_>::end(this_00)
  ;
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_SSM::Observable_*const_*,_std::vector<const_SSM::Observable_*,_std::allocator<const_SSM::Observable_*>_>_>
                                     *)&obs), bVar1) {
    local_90 = __gnu_cxx::
               __normal_iterator<const_SSM::Observable_*const_*,_std::vector<const_SSM::Observable_*,_std::allocator<const_SSM::Observable_*>_>_>
               ::operator*(&__end1);
    local_98 = (value_type_conflict1)
               (*(code *)**(undefined8 **)*local_90)(*local_90,local_68._M_current);
    std::vector<double,_std::allocator<double>_>::push_back(__return_storage_ptr__,&local_98);
    iVar2 = (**(code **)(*(long *)*local_90 + 0x18))();
    __gnu_cxx::
    __normal_iterator<const_std::byte_*,_std::vector<std::byte,_std::allocator<std::byte>_>_>::
    operator+=(&local_68,(long)iVar2);
    __gnu_cxx::
    __normal_iterator<const_SSM::Observable_*const_*,_std::vector<const_SSM::Observable_*,_std::allocator<const_SSM::Observable_*>_>_>
    ::operator++(&__end1);
  }
  std::vector<std::byte,_std::allocator<std::byte>_>::~vector
            ((vector<std::byte,_std::allocator<std::byte>_> *)&it);
  return __return_storage_ptr__;
}

Assistant:

Values ECUPort::singleRead(const Observables& observables) const
  {
    sendRequest(buildReadRequest(observables, false));

    Bytes response = readECUPacket(false);
    Bytes::const_iterator it = skipToData(response);
    Values values;
    for(const auto& obs: observables)
      {
	values.push_back(obs->convert(it));
	it += obs->numBytes();
      }
    
    return values;
  }